

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

Id __thiscall spv::Builder::makeForwardPointerDebugType(Builder *this,StorageClass storageClass)

{
  iterator __position;
  Id IVar1;
  Id IVar2;
  Instruction *pIVar3;
  vector<spv::Instruction*,std::allocator<spv::Instruction*>> *this_00;
  Id IVar4;
  Instruction *type;
  Instruction *local_38;
  _Head_base<0UL,_spv::Instruction_*,_false> local_30;
  
  IVar1 = makeIntegerType(this,0x20,false);
  IVar1 = makeIntConstant(this,IVar1,storageClass,false);
  addExtension(this,"SPV_KHR_relaxed_extended_instruction");
  pIVar3 = (Instruction *)operator_new(0x60);
  IVar4 = this->uniqueId + 1;
  this->uniqueId = IVar4;
  IVar2 = makeVoidType(this);
  pIVar3->_vptr_Instruction = (_func_int **)&PTR__Instruction_0093fd28;
  pIVar3->resultId = IVar4;
  pIVar3->typeId = IVar2;
  pIVar3->opCode = OpExtInstWithForwardRefsKHR;
  (pIVar3->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (pIVar3->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (pIVar3->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar3->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pIVar3->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pIVar3->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (pIVar3->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (pIVar3->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  pIVar3->block = (Block *)0x0;
  local_38 = pIVar3;
  Instruction::addIdOperand(pIVar3,this->nonSemanticShaderDebugInfo);
  Instruction::addImmediateOperand(local_38,3);
  Instruction::addIdOperand(local_38,local_38->resultId);
  Instruction::addIdOperand(local_38,IVar1);
  pIVar3 = local_38;
  IVar1 = makeIntegerType(this,0x20,false);
  IVar1 = makeIntConstant(this,IVar1,0,false);
  Instruction::addIdOperand(pIVar3,IVar1);
  local_30._M_head_impl._0_4_ = 3;
  this_00 = (vector<spv::Instruction*,std::allocator<spv::Instruction*>> *)
            std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->groupedDebugTypes,(key_type *)&local_30);
  __position._M_current = *(Instruction ***)(this_00 + 8);
  if (__position._M_current == *(Instruction ***)(this_00 + 0x10)) {
    std::vector<spv::Instruction*,std::allocator<spv::Instruction*>>::
    _M_realloc_insert<spv::Instruction*const&>(this_00,__position,&local_38);
  }
  else {
    *__position._M_current = local_38;
    *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
  }
  local_30._M_head_impl = local_38;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&this->constantsTypesGlobals,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_30);
  if (local_30._M_head_impl != (Instruction *)0x0) {
    (*(local_30._M_head_impl)->_vptr_Instruction[1])();
  }
  Module::mapInstruction(&this->module,local_38);
  return local_38->resultId;
}

Assistant:

Id Builder::makeForwardPointerDebugType(StorageClass storageClass)
{
    const Id scID = makeUintConstant(storageClass);

    this->addExtension(spv::E_SPV_KHR_relaxed_extended_instruction);

    Instruction *type = new Instruction(getUniqueId(), makeVoidType(), OpExtInstWithForwardRefsKHR);
    type->addIdOperand(nonSemanticShaderDebugInfo);
    type->addImmediateOperand(NonSemanticShaderDebugInfo100DebugTypePointer);
    type->addIdOperand(type->getResultId());
    type->addIdOperand(scID);
    type->addIdOperand(makeUintConstant(0));

    groupedDebugTypes[NonSemanticShaderDebugInfo100DebugTypePointer].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    return type->getResultId();
}